

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

bool load_png(char *pFilename,image_u8 *img)

{
  pointer pcVar1;
  uint uVar2;
  uint h;
  uint w;
  allocator<char> local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  string local_38;
  
  img->m_width = 0;
  img->m_height = 0;
  pcVar1 = (img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  w = 0;
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  h = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pFilename,&local_59);
  uVar2 = lodepng::decode(&pixels,&w,&h,&local_38,LCT_RGBA,8);
  std::__cxx11::string::~string((string *)&local_38);
  if (uVar2 == 0) {
    image_u8::init(img,(EVP_PKEY_CTX *)(ulong)w);
    memcpy((img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
           .super__Vector_impl_data._M_start,
           pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,(ulong)(h * w) << 2);
  }
  else {
    fprintf(_stderr,"Failed loading PNG file %s\n",pFilename);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar2 == 0;
}

Assistant:

static bool load_png(const char *pFilename, image_u8 &img)
{
	img.clear();

	std::vector<unsigned char> pixels;
	unsigned int w = 0, h = 0;
	unsigned int e = lodepng::decode(pixels, w, h, pFilename);
	if (e != 0)
	{
		fprintf(stderr, "Failed loading PNG file %s\n", pFilename);
		return false;
	}

	img.init(w, h);
	memcpy(&img.get_pixels()[0], &pixels[0], w * h * sizeof(uint32_t));
	
	return true;
}